

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.h
# Opt level: O1

void __thiscall
capnp::compiler::BrandScope::BrandScope
          (BrandScope *this,BrandScope *base,Array<capnp::compiler::BrandedDecl> *params)

{
  uint *puVar1;
  BrandScope *pBVar2;
  Disposer *pDVar3;
  BrandScope *pBVar4;
  Refcounted *refcounted;
  
  (this->super_Refcounted).refcount = 0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_002189c0;
  this->errorReporter = base->errorReporter;
  (this->parent).ptr.disposer = (Disposer *)0x0;
  (this->parent).ptr.ptr = (BrandScope *)0x0;
  this->leafId = base->leafId;
  this->leafParamCount = base->leafParamCount;
  this->inherited = false;
  (this->params).ptr = params->ptr;
  (this->params).size_ = params->size_;
  (this->params).disposer = params->disposer;
  params->ptr = (BrandedDecl *)0x0;
  params->size_ = 0;
  if ((base->parent).ptr.ptr != (BrandScope *)0x0) {
    pBVar2 = (base->parent).ptr.ptr;
    puVar1 = &(pBVar2->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    pDVar3 = (this->parent).ptr.disposer;
    pBVar4 = (this->parent).ptr.ptr;
    (this->parent).ptr.disposer = (Disposer *)pBVar2;
    (this->parent).ptr.ptr = pBVar2;
    if (pBVar4 != (BrandScope *)0x0) {
      (**pDVar3->_vptr_Disposer)
                (pDVar3,(pBVar4->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                        (long)&(pBVar4->super_Refcounted).super_Disposer._vptr_Disposer);
    }
  }
  return;
}

Assistant:

inline BrandedDecl(Resolver::ResolvedDecl decl,
                     kj::Own<BrandScope>&& brand,
                     Expression::Reader source)
      : brand(kj::mv(brand)), source(source) {
    // `source`, is the expression which specified this branded decl. It is provided so that errors
    // can be reported against it. It is acceptable to pass a default-initialized reader if there's
    // no source expression; errors will then be reported at 0, 0.

    body.init<Resolver::ResolvedDecl>(kj::mv(decl));
  }